

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Font.cpp
# Opt level: O2

void __thiscall nite::Font::load(Font *this,string *path,uint size,float thickness)

{
  pointer *path_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  int iVar2;
  FT_Module pFVar3;
  bool bVar4;
  __type _Var5;
  uint i_1;
  FT_Error FVar6;
  uint uVar7;
  FT_UInt glyph_index;
  ulong uVar8;
  FT_Library *aface;
  pointer pfVar9;
  ulong uVar10;
  uint number;
  int number_00;
  int number_01;
  int number_02;
  uint number_03;
  int iVar11;
  float *pfVar12;
  fontT *this_00;
  int *piVar13;
  string *__return_storage_ptr__;
  Vec2 VVar14;
  long lVar15;
  uint i;
  uint uVar16;
  fontT local_1228;
  undefined1 local_188 [8];
  string fileHash;
  GLuint atlas;
  float fStack_148;
  float fStack_144;
  vector<Single,_std::allocator<Single>_> frags;
  string filename;
  Vec2 local_108;
  undefined1 local_f8 [8];
  string pathAndSize;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  Vec2 local_98;
  FT_Stroker stroker;
  FT_Glyph glyph;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  Vec2 local_60;
  FT_Glyph stroke;
  Vec2 local_50;
  FT_Library library;
  FT_Face_conflict face;
  Vec2 dims;
  
  path_00 = &frags.super__Vector_base<Single,_std::allocator<Single>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  dims.y = thickness;
  std::__cxx11::string::string((string *)path_00,(string *)path);
  this->ln = -1.0;
  bVar4 = fileExists((string *)path_00);
  if (bVar4) {
    FVar6 = FT_Init_FreeType((FT_Library *)&local_50);
    if (FVar6 != 0) {
      print("failure starting FreeType: FT_Init_FreeType");
      goto LAB_001a34c1;
    }
    aface = &library;
    FVar6 = FT_New_Face((FT_Library)local_50,
                        (char *)frags.super__Vector_base<Single,_std::allocator<Single>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage,0,
                        (FT_Face_conflict *)aface);
    if (FVar6 != 0) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8,
                     "failure loading font \'",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &frags.super__Vector_base<Single,_std::allocator<Single>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &local_1228,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8,
                     "\': FT_New_Face");
      print((string *)&local_1228);
      std::__cxx11::string::~string((string *)&local_1228);
      std::__cxx11::string::~string((string *)local_f8);
      FT_Done_FreeType((FT_Library)local_50);
      goto LAB_001a34c1;
    }
    unload(this);
    toStr_abi_cxx11_((string *)&local_1228,(nite *)(ulong)size,number);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8,
                   path,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &local_1228);
    glyph = (FT_Glyph)path;
    stroke._4_4_ = size;
    std::__cxx11::string::~string((string *)&local_1228);
    hashMemory_abi_cxx11_
              ((string *)local_188,(nite *)local_f8,pathAndSize._M_dataplus._M_p,(size_t)aface);
    uVar16 = 0;
    while( true ) {
      pfVar9 = fontList.super__Vector_base<fontT,_std::allocator<fontT>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar10 = (ulong)uVar16;
      uVar8 = ((long)fontList.super__Vector_base<fontT,_std::allocator<fontT>_>._M_impl.
                     super__Vector_impl_data._M_finish -
              (long)fontList.super__Vector_base<fontT,_std::allocator<fontT>_>._M_impl.
                    super__Vector_impl_data._M_start) / 0x10a0;
      local_1228.glyphs[0].coors = (Vec2)this;
      if (uVar8 <= uVar10) break;
      _Var5 = std::operator==(&fontList.super__Vector_base<fontT,_std::allocator<fontT>_>._M_impl.
                               super__Vector_impl_data._M_start[uVar10].hash,
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_188);
      if (_Var5) {
        this->objectId = uVar16;
        if (-1 < (int)uVar16) {
          std::vector<nite::Font*,std::allocator<nite::Font*>>::emplace_back<nite::Font*>
                    ((vector<nite::Font*,std::allocator<nite::Font*>> *)
                     &fontList.super__Vector_base<fontT,_std::allocator<fontT>_>._M_impl.
                      super__Vector_impl_data._M_start[uVar10].owners,(Font **)&local_1228);
          goto LAB_001a3e88;
        }
        uVar8 = ((long)fontList.super__Vector_base<fontT,_std::allocator<fontT>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                (long)fontList.super__Vector_base<fontT,_std::allocator<fontT>_>._M_impl.
                      super__Vector_impl_data._M_start) / 0x10a0;
        pfVar9 = fontList.super__Vector_base<fontT,_std::allocator<fontT>_>._M_impl.
                 super__Vector_impl_data._M_start;
        goto LAB_001a3671;
      }
      uVar16 = uVar16 + 1;
    }
    this->objectId = -1;
LAB_001a3671:
    uVar16 = stroke._4_4_;
    piVar13 = &this->objectId;
    for (uVar7 = 0; uVar7 < uVar8; uVar7 = uVar7 + 1) {
      if (pfVar9[uVar7].empty != false) goto LAB_001a36c8;
    }
    fontT::fontT(&local_1228);
    std::vector<fontT,_std::allocator<fontT>_>::emplace_back<fontT>(&fontList,&local_1228);
    fontT::~fontT(&local_1228);
    uVar7 = (uint)uVar8;
    pfVar9 = fontList.super__Vector_base<fontT,_std::allocator<fontT>_>._M_impl.
             super__Vector_impl_data._M_start;
LAB_001a36c8:
    this->objectId = uVar7;
    pfVar9[(int)uVar7].empty = false;
    std::vector<nite::Font*,std::allocator<nite::Font*>>::emplace_back<nite::Font*>
              ((vector<nite::Font*,std::allocator<nite::Font*>> *)&pfVar9[(int)uVar7].owners,
               (Font **)&local_1228);
    std::__cxx11::string::_M_assign
              ((string *)
               &fontList.super__Vector_base<fontT,_std::allocator<fontT>_>._M_impl.
                super__Vector_impl_data._M_start[*piVar13].hash);
    std::__cxx11::string::_M_assign
              ((string *)
               &fontList.super__Vector_base<fontT,_std::allocator<fontT>_>._M_impl.
                super__Vector_impl_data._M_start[*piVar13].filename);
    pfVar9 = fontList.super__Vector_base<fontT,_std::allocator<fontT>_>._M_impl.
             super__Vector_impl_data._M_start;
    iVar2 = *piVar13;
    FVar6 = FT_Set_Char_Size((FT_Face)library,(ulong)(uVar16 << 6),(ulong)(uVar16 << 6),0x60,0x60);
    if (FVar6 == 0) {
      if (0.0 < dims.y) {
        FT_Stroker_New((FT_Library)local_50,(FT_Stroker *)&local_98);
        FT_Stroker_Set((FT_Stroker)local_98,(long)(int)(dims.y * 64.0),FT_STROKER_LINECAP_ROUND,
                       FT_STROKER_LINEJOIN_ROUND,0);
      }
      fStack_148 = 0.0;
      fStack_144 = 0.0;
      frags.super__Vector_base<Single,_std::allocator<Single>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      frags.super__Vector_base<Single,_std::allocator<Single>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      Vec2::Vec2((Vec2 *)&face);
      pfVar12 = &pfVar9[iVar2].glyphs[0x20].index.y;
      filename.field_2._8_8_ = 0;
      uVar8 = 0x20;
      while( true ) {
        __return_storage_ptr__ = (string *)(&fileHash.field_2._M_allocated_capacity + 1);
        if (uVar8 == 0x80) break;
        glyph_index = FT_Get_Char_Index((FT_Face)library,uVar8);
        FVar6 = FT_Load_Glyph((FT_Face)library,glyph_index,0);
        if (FVar6 == 0) {
          FVar6 = FT_Get_Glyph((FT_GlyphSlot)library->modules[0x10],(FT_Glyph *)&stroker);
          if (FVar6 != 0) {
            toStr_abi_cxx11_(__return_storage_ptr__,(nite *)(uVar8 & 0xffffffff),number_01);
            std::operator+(&local_b8,"failed to load char \'",__return_storage_ptr__);
            pbVar1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&pathAndSize.field_2 + 8);
            std::operator+(pbVar1,&local_b8,"\' for font \'");
            std::operator+(&local_80,pbVar1,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &frags.super__Vector_base<Single,_std::allocator<Single>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_1228,&local_80,"\'");
            print((string *)&local_1228);
            goto LAB_001a398c;
          }
          if (0.0 < dims.y) {
            FVar6 = FT_Get_Glyph((FT_GlyphSlot)library->modules[0x10],(FT_Glyph *)&local_60);
            if (FVar6 != 0) {
              toStr_abi_cxx11_(__return_storage_ptr__,(nite *)(uVar8 & 0xffffffff),number_02);
              std::operator+(&local_b8,"failed to load char \'",__return_storage_ptr__);
              pbVar1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&pathAndSize.field_2 + 8);
              std::operator+(pbVar1,&local_b8,"\' for font \'");
              std::operator+(&local_80,pbVar1,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &frags.super__Vector_base<Single,_std::allocator<Single>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &local_1228,&local_80,"\'");
              print((string *)&local_1228);
              goto LAB_001a398c;
            }
            FT_Glyph_StrokeBorder((FT_Glyph *)&local_60,(FT_Stroker)local_98,'\0','\x01');
          }
          FT_Glyph_To_Bitmap((FT_Glyph *)&stroker,FT_RENDER_MODE_NORMAL,(FT_Vector *)0x0,'\x01');
          VVar14 = (Vec2)stroker;
          if (0.0 < dims.y) {
            FT_Glyph_To_Bitmap((FT_Glyph *)&local_60,FT_RENDER_MODE_NORMAL,(FT_Vector *)0x0,'\x01');
            local_108 = local_60;
          }
          local_1228.glyphs[0].size.x = 0.0;
          local_1228.glyphs[0].size.y = 0.0;
          if ((dims.y != 0.0) || (NAN(dims.y))) {
            Single::strong((Single *)&local_1228,*(int *)((long)local_108 + 0x34),
                           *(int *)((long)local_108 + 0x30),*(uchar **)((long)local_108 + 0x40));
            Single::blitz((Single *)&local_1228,
                          *(int *)((long)&((FT_Stroker)VVar14)->subpath_angle + 4),
                          (int)((FT_Stroker)VVar14)->subpath_angle,
                          (uchar *)(((FT_Stroker)VVar14)->subpath_start).y);
          }
          else {
            Single::pure((Single *)&local_1228,
                         *(int *)((long)&((FT_Stroker)VVar14)->subpath_angle + 4),
                         (int)((FT_Stroker)VVar14)->subpath_angle,
                         (uchar *)(((FT_Stroker)VVar14)->subpath_start).y);
          }
          std::vector<Single,_std::allocator<Single>_>::push_back
                    ((vector<Single,_std::allocator<Single>_> *)&stack0xfffffffffffffeb8,
                     (value_type *)&local_1228);
          if (dims.y != 0.0) {
            VVar14 = local_108;
          }
          if (NAN(dims.y)) {
            VVar14 = local_108;
          }
          ((Vec2 *)(pfVar12 + -1))->x = (float)(int)filename.field_2._8_8_;
          *pfVar12 = 0.0;
          uVar16 = *(uint *)((long)VVar14 + 0x34);
          pfVar12[-7] = (float)uVar16;
          uVar7 = *(uint *)((long)VVar14 + 0x30);
          pfVar12[-6] = (float)uVar7;
          pfVar12[-3] = (float)*(int *)((long)VVar14 + 0x28);
          pfVar12[-2] = (float)*(int *)((long)VVar14 + 0x2c);
          pFVar3 = library->modules[0x10];
          pfVar12[-5] = (float)((long)pFVar3[5].library >> 6);
          pfVar12[-4] = (float)((long)pFVar3[3].clazz >> 6);
          face._0_4_ = (float)(uVar16 + 2) + face._0_4_;
          uVar10 = (long)face._4_4_ & 0xffffffff;
          if ((uint)(long)face._4_4_ < uVar7) {
            uVar10 = (ulong)uVar7;
          }
          face._4_4_ = (float)uVar10;
          FT_Done_Glyph((FT_Glyph)stroker);
          if (0.0 < dims.y) {
            FT_Done_Glyph((FT_Glyph)local_60);
          }
          filename.field_2._8_8_ = ZEXT48((int)filename.field_2._8_8_ + uVar16 + 2);
        }
        else {
          toStr_abi_cxx11_(__return_storage_ptr__,(nite *)(uVar8 & 0xffffffff),number_00);
          std::operator+(&local_b8,"failed to load char \'",__return_storage_ptr__);
          pbVar1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&pathAndSize.field_2 + 8);
          std::operator+(pbVar1,&local_b8,"\' for font \'");
          std::operator+(&local_80,pbVar1,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &frags.super__Vector_base<Single,_std::allocator<Single>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_1228,&local_80,"\'");
          print((string *)&local_1228);
LAB_001a398c:
          std::__cxx11::string::~string((string *)&local_1228);
          std::__cxx11::string::~string((string *)&local_80);
          std::__cxx11::string::~string((string *)(pathAndSize.field_2._M_local_buf + 8));
          std::__cxx11::string::~string((string *)&local_b8);
          std::__cxx11::string::~string((string *)__return_storage_ptr__);
        }
        uVar8 = uVar8 + 1;
        pfVar12 = pfVar12 + 8;
      }
      pfVar9[iVar2].vertAdvance = (float)((long)library->modules[0x11][2].memory >> 6);
      glEnable(0xde1);
      glGenTextures(1,(undefined1 *)((long)&fileHash.field_2 + 8));
      glBindTexture(0xde1,fileHash.field_2._8_4_);
      glPixelStorei(0xcf5,1);
      glTexParameteri(0xde1,0x2800,0x2601);
      glTexParameteri(0xde1,0x2801,0x2601);
      iVar11 = 0;
      glTexImage2D(0xde1,0,0x1908,(int)face._0_4_,(int)face._4_4_,0,0x1908,0x1401,0);
      lVar15 = 0;
      uVar8 = 0;
      while( true ) {
        VVar14 = _fStack_148;
        if ((ulong)(((long)frags.super__Vector_base<Single,_std::allocator<Single>_>._M_impl.
                           super__Vector_impl_data._M_start - (long)_fStack_148) / 0x18) <= uVar8)
        break;
        glTexSubImage2D(0xde1,0,iVar11,0,*(undefined4 *)((long)_fStack_148 + lVar15),
                        *(undefined4 *)((long)((long)_fStack_148 + 4) + lVar15),0x1908,0x1401,
                        *(undefined8 *)((long)((long)_fStack_148 + 8) + lVar15));
        iVar11 = iVar11 + ((Single *)((long)VVar14 + lVar15))->w + 2;
        Single::clear((Single *)((long)VVar14 + lVar15));
        uVar8 = uVar8 + 1;
        lVar15 = lVar15 + 0x18;
      }
      glPixelStorei(0xcf5,4,((long)frags.super__Vector_base<Single,_std::allocator<Single>_>._M_impl
                                   .super__Vector_impl_data._M_start - (long)_fStack_148) % 0x18);
      std::__cxx11::string::_M_assign((string *)&pfVar9[iVar2].hash);
      VVar14.y = face._4_4_;
      VVar14.x = face._0_4_;
      pfVar9[iVar2].atlasSize = VVar14;
      std::__cxx11::string::_M_assign((string *)&pfVar9[iVar2].path);
      uVar16 = stroke._4_4_;
      pfVar9[iVar2].size = stroke._4_4_;
      pfVar9[iVar2].empty = false;
      pfVar9[iVar2].atlas = fileHash.field_2._8_4_;
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&pathAndSize.field_2 + 8),"loaded font \'",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &frags.super__Vector_base<Single,_std::allocator<Single>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
      std::operator+(&local_80,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&pathAndSize.field_2 + 8),"\' size: ");
      toStr_abi_cxx11_(&local_b8,(nite *)(ulong)uVar16,number_03);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &local_1228,&local_80,&local_b8);
      print((string *)&local_1228);
      std::__cxx11::string::~string((string *)&local_1228);
      std::__cxx11::string::~string((string *)&local_b8);
      std::__cxx11::string::~string((string *)&local_80);
      std::__cxx11::string::~string((string *)(pathAndSize.field_2._M_local_buf + 8));
      if (0.0 < dims.y) {
        FT_Stroker_Done((FT_Stroker)local_98);
      }
      FT_Done_Face((FT_Face)library);
      FT_Done_FreeType((FT_Library)local_50);
      std::_Vector_base<Single,_std::allocator<Single>_>::~_Vector_base
                ((_Vector_base<Single,_std::allocator<Single>_> *)&stack0xfffffffffffffeb8);
    }
    else {
      std::operator+(&local_80,"failure loading font \'",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &frags.super__Vector_base<Single,_std::allocator<Single>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &local_1228,&local_80,"\': FT_New_Face");
      print((string *)&local_1228);
      std::__cxx11::string::~string((string *)&local_1228);
      std::__cxx11::string::~string((string *)&local_80);
      FT_Done_FreeType((FT_Library)local_50);
    }
LAB_001a3e88:
    this_00 = (fontT *)local_188;
  }
  else {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8,
                   "couldn\'t load font \'",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &frags.super__Vector_base<Single,_std::allocator<Single>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1228,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8,
                   "\': doesn\'t exist");
    print((string *)&local_1228);
    this_00 = &local_1228;
  }
  std::__cxx11::string::~string((string *)this_00);
  std::__cxx11::string::~string((string *)local_f8);
LAB_001a34c1:
  std::__cxx11::string::~string
            ((string *)
             &frags.super__Vector_base<Single,_std::allocator<Single>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

void nite::Font::load(const String &path, unsigned size, float thickness){
	FT_Library library;
	FT_Face face;
	String filename = path;
	size *= SCALING;
	ln = -1.0f;

	if(!nite::fileExists(filename)){
		nite::print("couldn't load font '"+filename+"': doesn't exist");
		return;
	}

	if(FT_Init_FreeType(&library)){
		nite::print("failure starting FreeType: FT_Init_FreeType");
		return;
	}

	if(FT_New_Face(library, filename.c_str(), 0, &face)) {
		nite::print("failure loading font '"+filename+"': FT_New_Face");
		FT_Done_FreeType(library);
		return;
	}	

	unload();
	String pathAndSize = path+nite::toStr(size);
	String fileHash = nite::hashMemory((char*)pathAndSize.c_str(), pathAndSize.size());
	objectId = getSlotByHash(fileHash);
	if (objectId <= -1){
		objectId = getEmptySlot();
		fontList[objectId].empty = false;
		fontList[objectId].owners.push_back(this);
		fontList[objectId].hash = fileHash;
    	fontList[objectId].filename = path;
	}else{
		fontList[objectId].owners.push_back(this);
		return;
	}
	fontT &proxy = fontList[objectId];


	if(FT_Set_Char_Size(face, size << 6, size << 6, 96, 96)){
		nite::print("failure loading font '"+filename+"': FT_New_Face");
		FT_Done_FreeType(library);		
		return;
	}

	FT_Stroker stroker;
	if(thickness > 0.0f){
		FT_Stroker_New(library, &stroker);
		FT_Stroker_Set(stroker, (int)(thickness * 64.0f), FT_STROKER_LINECAP_ROUND, FT_STROKER_LINEJOIN_ROUND, 0);
	}
	Vector<Single> frags; // maybe a vector could be too slow?
	nite::Vec2 dims;
	int xcursor = 0.0f;
	// render characters
	for(int i = ASCII_MIN; i < ASCII_MAX; i++){
		FT_UInt cindex = FT_Get_Char_Index(face, i);
		FT_Glyph glyph, stroke;
		if(FT_Load_Glyph(face, cindex, FT_LOAD_DEFAULT)){
			nite::print("failed to load char '"+nite::toStr((char)i)+"' for font '"+filename+"'");
			continue;
		}
		if(FT_Get_Glyph(face->glyph, &glyph)){
			nite::print("failed to load char '"+nite::toStr((char)i)+"' for font '"+filename+"'");
			continue;
		}
		if(thickness > 0.0f){
			if(FT_Get_Glyph(face->glyph, &stroke)){
				nite::print("failed to load char '"+nite::toStr((char)i)+"' for font '"+filename+"'");
				continue;
			}		
			// stroke
			FT_Glyph_StrokeBorder(&stroke, stroker, 0, 1);			
		}
		// render to bitmap
		FT_Glyph_To_Bitmap(&glyph, FT_RENDER_MODE_NORMAL, NULL, true);
		FT_BitmapGlyph bitmap = reinterpret_cast<FT_BitmapGlyph>(glyph);
		FT_BitmapGlyph bitmapStroke;
		if(thickness > 0.0f){
			FT_Glyph_To_Bitmap(&stroke, FT_RENDER_MODE_NORMAL, NULL, true);
			bitmapStroke = reinterpret_cast<FT_BitmapGlyph>(stroke);
		}
		
		Single buffer;

		// render filler alone
		if(thickness == 0.0f){
			buffer = Single();
			buffer.pure(bitmap->bitmap.width, bitmap->bitmap.rows, bitmap->bitmap.buffer);
		// render outline as a strong and blit on it the filler
		}else{
			buffer = Single();
			buffer.strong(bitmapStroke->bitmap.width, bitmapStroke->bitmap.rows, bitmapStroke->bitmap.buffer);
			buffer.blitz(bitmap->bitmap.width, bitmap->bitmap.rows, bitmap->bitmap.buffer);		
		}

		frags.push_back(buffer);
		auto biggest = thickness == 0.0f ? bitmap : bitmapStroke;

		// metrics
		proxy.glyphs[i].index.x = xcursor;
		proxy.glyphs[i].index.y = 0;
		proxy.glyphs[i].coors.x = biggest->bitmap.width;
		proxy.glyphs[i].coors.y = biggest->bitmap.rows;
		proxy.glyphs[i].orig.x = biggest->left;
		proxy.glyphs[i].orig.y = biggest->top; 
		proxy.glyphs[i].size.x = face->glyph->advance.x >> 6;
		proxy.glyphs[i].size.y = face->glyph->metrics.horiBearingY >> 6;
		// atlas info
		dims.x += biggest->bitmap.width + 2;
		dims.y = std::max((unsigned)dims.y, biggest->bitmap.rows);
		// cursor update
		xcursor += biggest->bitmap.width + 2;
		FT_Done_Glyph(glyph);
		if(thickness > 0.0f){
			FT_Done_Glyph(stroke);
		}
	}
	proxy.vertAdvance = face->size->metrics.height >> 6;

	// compose atlas
	// TODO: might use a more complex algorithm than just a very long texture
	// specially if we ever get to implement unicode
	GLuint atlas;
	glEnable(GL_TEXTURE_2D);
	glGenTextures(1, &atlas);
	glBindTexture(GL_TEXTURE_2D, atlas);
	glPixelStorei(GL_UNPACK_ALIGNMENT, 1);
	glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_LINEAR);
	glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_LINEAR);	
	glTexImage2D(GL_TEXTURE_2D, 0, GL_RGBA, dims.x, dims.y, 0, GL_RGBA, GL_UNSIGNED_BYTE, 0);	
	xcursor = 0;
	for(int i = 0; i < frags.size(); ++i){
		auto &frag = frags[i];
		glTexSubImage2D(GL_TEXTURE_2D, 0, xcursor, 0, frag.w, frag.h, GL_RGBA, GL_UNSIGNED_BYTE, frag.buffer);
		xcursor += frag.w + 2;
		frag.clear();
	}
	glPixelStorei(GL_UNPACK_ALIGNMENT, 4);
	// finish up
	proxy.hash = fileHash;
	proxy.atlasSize = dims;
	proxy.path = path;
	proxy.size = size;
	proxy.empty = false;
	proxy.atlas = atlas;

	nite::print("loaded font '"+filename+"' size: "+nite::toStr(size));

	// clean up
	if(thickness > 0.0f){
		FT_Stroker_Done(stroker);
	}
	FT_Done_Face(face);
	FT_Done_FreeType(library);
}